

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionImageMetadataUniform
          (ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint uVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_960;
  DiagnosticStream local_788;
  DiagnosticStream local_5b0;
  DiagnosticStream local_3d8;
  DiagnosticStream local_200;
  spv_result_t local_24;
  Instruction *pIStack_20;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = ValidateKernelDecl(_,inst);
  pIVar1 = inst_local;
  __local._4_4_ = local_24;
  if (local_24 == SPV_SUCCESS) {
    uVar3 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,5);
    bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
    pIVar1 = inst_local;
    if (bVar2) {
      uVar3 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,6);
      bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
      pIVar1 = inst_local;
      if (bVar2) {
        uVar3 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,7);
        bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
        pIVar1 = inst_local;
        if (bVar2) {
          uVar3 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,8);
          bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
          pIVar1 = inst_local;
          if (bVar2) {
            uVar3 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,9);
            bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
            if (bVar2) {
              __local._4_4_ = SPV_SUCCESS;
            }
            else {
              ValidationState_t::diag
                        (&local_960,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20)
              ;
              pDVar4 = DiagnosticStream::operator<<(&local_960,(char (*) [50])0xd21ce1);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
              DiagnosticStream::~DiagnosticStream(&local_960);
            }
          }
          else {
            ValidationState_t::diag
                      (&local_788,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
            pDVar4 = DiagnosticStream::operator<<(&local_788,(char (*) [52])0xd21e5d);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_788);
          }
        }
        else {
          ValidationState_t::diag
                    (&local_5b0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_5b0,
                              (char (*) [53])"Binding must be a 32-bit unsigned integer OpConstant")
          ;
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_5b0);
        }
      }
      else {
        ValidationState_t::diag
                  (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar4 = DiagnosticStream::operator<<
                           (&local_3d8,
                            (char (*) [59])
                            "DescriptorSet must be a 32-bit unsigned integer OpConstant");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_3d8);
      }
    }
    else {
      ValidationState_t::diag
                (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_200,
                          (char (*) [53])"Ordinal must be a 32-bit unsigned integer OpConstant");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_200);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionImageMetadataUniform(
    ValidationState_t& _, const Instruction* inst) {
  if (auto error = ValidateKernelDecl(_, inst)) {
    return error;
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Ordinal must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "DescriptorSet must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(7))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Binding must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(8))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Offset must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(9))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Size must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}